

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

int __thiscall teebuf::overflow(teebuf *this,int c)

{
  int iVar1;
  int iVar2;
  
  iVar1 = std::streambuf::sputc((char)this->sb1_);
  iVar2 = std::streambuf::sputc((char)this->sb2_);
  if (iVar2 != -1) {
    iVar2 = c;
  }
  if (iVar1 == -1) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

virtual int overflow( int c )
    {
        int r1 = sb1_->sputc( c );
        int r2 = sb2_->sputc( c );

        return r1 == EOF || r2 == EOF? EOF : c;
    }